

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Return_Button.cxx
# Opt level: O0

void __thiscall Fl_Return_Button::draw(Fl_Return_Button *this)

{
  uchar uVar1;
  char cVar2;
  Fl_Boxtype FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Widget *pFVar9;
  undefined4 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_1c;
  int W;
  int dx;
  Fl_Boxtype bt;
  Fl_Return_Button *this_local;
  
  uVar1 = Fl_Widget::type((Fl_Widget *)this);
  if (uVar1 != '\x03') {
    cVar2 = Fl_Button::value(&this->super_Fl_Button);
    if (cVar2 == '\0') {
      local_30 = Fl_Widget::box((Fl_Widget *)this);
    }
    else {
      FVar3 = Fl_Button::down_box(&this->super_Fl_Button);
      if (FVar3 == FL_NO_BOX) {
        FVar3 = Fl_Widget::box((Fl_Widget *)this);
        local_2c = fl_down(FVar3);
      }
      else {
        local_2c = Fl_Button::down_box(&this->super_Fl_Button);
      }
      local_30 = local_2c;
    }
    iVar4 = Fl::box_dx(local_30);
    cVar2 = Fl_Button::value(&this->super_Fl_Button);
    if (cVar2 == '\0') {
      local_38 = Fl_Widget::color((Fl_Widget *)this);
    }
    else {
      local_38 = Fl_Widget::selection_color((Fl_Widget *)this);
    }
    Fl_Widget::draw_box((Fl_Widget *)this,local_30,local_38);
    local_1c = Fl_Widget::h((Fl_Widget *)this);
    iVar5 = Fl_Widget::w((Fl_Widget *)this);
    if (iVar5 / 3 < local_1c) {
      local_1c = Fl_Widget::w((Fl_Widget *)this);
      local_1c = local_1c / 3;
    }
    iVar5 = Fl_Widget::x((Fl_Widget *)this);
    iVar6 = Fl_Widget::w((Fl_Widget *)this);
    iVar7 = Fl_Widget::y((Fl_Widget *)this);
    iVar8 = Fl_Widget::h((Fl_Widget *)this);
    fl_return_arrow((iVar5 + iVar6) - (local_1c + iVar4),iVar7,local_1c,iVar8);
    iVar5 = Fl_Widget::x((Fl_Widget *)this);
    iVar6 = Fl_Widget::y((Fl_Widget *)this);
    iVar7 = Fl_Widget::w((Fl_Widget *)this);
    iVar8 = Fl_Widget::h((Fl_Widget *)this);
    Fl_Widget::draw_label
              ((Fl_Widget *)this,iVar5 + iVar4,iVar6,iVar7 + (iVar4 * -2 - local_1c),iVar8);
    pFVar9 = Fl::focus();
    if (pFVar9 == (Fl_Widget *)this) {
      Fl_Widget::draw_focus((Fl_Widget *)this);
    }
  }
  return;
}

Assistant:

void Fl_Return_Button::draw() {
  if (type() == FL_HIDDEN_BUTTON) return;
  Fl_Boxtype bt = value() ? (down_box()?down_box():fl_down(box())) : box();
  int dx = Fl::box_dx(bt);
  draw_box(bt, value() ? selection_color() : color());
  int W = h();
  if (w()/3 < W) W = w()/3;
  fl_return_arrow(x()+w()-(W+dx), y(), W, h());
  draw_label(x()+dx, y(), w()-(dx+W+dx), h());
  if (Fl::focus() == this) draw_focus();
}